

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O1

int ddReorderChildren(DdManager *table,MtrNode *treenode,Cudd_ReorderingType method)

{
  uint uVar1;
  int iVar2;
  Cudd_AggregationType CVar3;
  MtrHalfWord MVar4;
  MtrHalfWord MVar5;
  int iVar6;
  code *pcVar7;
  long lVar8;
  int upper;
  MtrNode *pMVar9;
  uint *puVar10;
  long lVar11;
  uint lower;
  
  uVar1 = table->size;
  upper = -1;
  lower = uVar1;
  if ((int)treenode->low < (int)uVar1) {
    lower = table->perm[treenode->index];
    upper = lower + treenode->size + -1;
    if ((int)uVar1 <= upper) {
      pMVar9 = treenode->child;
      if (pMVar9 == (MtrNode *)0x0) {
        upper = uVar1 - 1;
      }
      else {
        iVar6 = -1;
        do {
          iVar2 = table->perm[pMVar9->low];
          upper = iVar2 + -1;
          if ((int)(pMVar9->size + upper) < (int)uVar1) {
            upper = iVar6;
          }
          if ((int)uVar1 <= iVar2) {
            upper = iVar6;
          }
          pMVar9 = pMVar9->younger;
          iVar6 = upper;
        } while (pMVar9 != (MtrNode *)0x0);
      }
    }
  }
  iVar6 = 1;
  if (upper == -1) {
    return 1;
  }
  if (treenode->flags == 4) goto LAB_00912210;
  switch(method) {
  case CUDD_REORDER_RANDOM:
  case CUDD_REORDER_RANDOM_PIVOT:
    iVar6 = cuddSwapping(table,lower,upper,method);
    break;
  case CUDD_REORDER_SIFT:
    iVar6 = cuddSifting(table,lower,upper);
    break;
  case CUDD_REORDER_SIFT_CONVERGE:
    do {
      uVar1 = table->keys;
      iVar2 = table->isolated;
      iVar6 = cuddSifting(table,lower,upper);
      if (uVar1 - iVar2 <= table->keys - table->isolated) break;
    } while (iVar6 != 0);
    break;
  case CUDD_REORDER_SYMM_SIFT:
    iVar6 = cuddSymmSifting(table,lower,upper);
    break;
  case CUDD_REORDER_SYMM_SIFT_CONV:
    iVar6 = cuddSymmSiftingConv(table,lower,upper);
    break;
  case CUDD_REORDER_WINDOW2:
  case CUDD_REORDER_WINDOW3:
  case CUDD_REORDER_WINDOW4:
  case CUDD_REORDER_WINDOW2_CONV:
  case CUDD_REORDER_WINDOW3_CONV:
  case CUDD_REORDER_WINDOW4_CONV:
    iVar6 = cuddWindowReorder(table,lower,upper,method);
    break;
  case CUDD_REORDER_GROUP_SIFT:
    CVar3 = table->groupcheck;
    if ((CVar3 == CUDD_GROUP_CHECK7) || (CVar3 == CUDD_GROUP_CHECK5)) {
      pcVar7 = ddExtSymmCheck;
    }
    else {
      if (CVar3 != CUDD_NO_CHECK) {
        fwrite("Unknown group ckecking method\n",0x1e,1,(FILE *)table->err);
        iVar6 = 0;
        break;
      }
      pcVar7 = ddNoCheck;
    }
    iVar6 = 0;
    goto LAB_0091220b;
  case CUDD_REORDER_GROUP_SIFT_CONV:
    do {
      uVar1 = table->keys;
      CVar3 = table->groupcheck;
      iVar2 = table->isolated;
      if ((CVar3 == CUDD_GROUP_CHECK7) || (CVar3 == CUDD_GROUP_CHECK5)) {
        pcVar7 = ddExtSymmCheck;
LAB_009120fc:
        ddGroupSifting(table,lower,upper,pcVar7,0);
      }
      else {
        if (CVar3 == CUDD_NO_CHECK) {
          pcVar7 = ddNoCheck;
          goto LAB_009120fc;
        }
        fwrite("Unknown group ckecking method\n",0x1e,1,(FILE *)table->err);
      }
      iVar6 = cuddWindowReorder(table,lower,upper,CUDD_REORDER_WINDOW4);
    } while ((table->keys - table->isolated < uVar1 - iVar2) && (iVar6 != 0));
    break;
  case CUDD_REORDER_ANNEALING:
    iVar6 = cuddAnnealing(table,lower,upper);
    break;
  case CUDD_REORDER_GENETIC:
    iVar6 = cuddGa(table,lower,upper);
    break;
  case CUDD_REORDER_LINEAR:
    iVar6 = cuddLinearAndSifting(table,lower,upper);
    break;
  case CUDD_REORDER_LINEAR_CONVERGE:
    do {
      uVar1 = table->keys;
      iVar2 = table->isolated;
      iVar6 = cuddLinearAndSifting(table,lower,upper);
      if (uVar1 - iVar2 <= table->keys - table->isolated) break;
    } while (iVar6 != 0);
    break;
  case CUDD_REORDER_LAZY_SIFT:
    pcVar7 = ddVarGroupCheck;
    iVar6 = 1;
LAB_0091220b:
    iVar6 = ddGroupSifting(table,lower,upper,pcVar7,iVar6);
    break;
  case CUDD_REORDER_EXACT:
    iVar6 = cuddExact(table,lower,upper);
    break;
  default:
    return 0;
  }
LAB_00912210:
  lVar8 = (long)(int)lower;
  if (table->tree != treenode) {
    if ((int)lower < upper) {
      puVar10 = &table->subtables[lVar8].next;
      lVar11 = upper - lVar8;
      uVar1 = lower;
      do {
        uVar1 = uVar1 + 1;
        *puVar10 = uVar1;
        puVar10 = puVar10 + 0xe;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
    table->subtables[upper].next = lower;
  }
  MVar4 = treenode->index;
  MVar5 = table->invperm[lVar8];
  do {
    treenode->index = MVar5;
    treenode = treenode->parent;
    if (treenode == (MtrNode *)0x0) {
      return iVar6;
    }
  } while (treenode->index == MVar4);
  return iVar6;
}

Assistant:

static int
ddReorderChildren(
  DdManager * table,
  MtrNode * treenode,
  Cudd_ReorderingType method)
{
    int lower;
    int upper = -1;
    int result;
    unsigned int initialSize;

    ddFindNodeHiLo(table,treenode,&lower,&upper);
    /* If upper == -1 these variables do not exist yet. */
    if (upper == -1)
        return(1);

    if (treenode->flags == MTR_FIXED) {
        result = 1;
    } else {
#ifdef DD_STATS
        (void) fprintf(table->out," ");
#endif
        switch (method) {
        case CUDD_REORDER_RANDOM:
        case CUDD_REORDER_RANDOM_PIVOT:
            result = cuddSwapping(table,lower,upper,method);
            break;
        case CUDD_REORDER_SIFT:
            result = cuddSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SIFT_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_SYMM_SIFT:
            result = cuddSymmSifting(table,lower,upper);
            break;
        case CUDD_REORDER_SYMM_SIFT_CONV:
            result = cuddSymmSiftingConv(table,lower,upper);
            break;
        case CUDD_REORDER_GROUP_SIFT:
            if (table->groupcheck == CUDD_NO_CHECK) {
                result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                        DD_NORMAL_SIFT);
            } else {
                (void) fprintf(table->err,
                               "Unknown group ckecking method\n");
                result = 0;
            }
            break;
        case CUDD_REORDER_GROUP_SIFT_CONV:
            do {
                initialSize = table->keys - table->isolated;
                if (table->groupcheck == CUDD_NO_CHECK) {
                    result = ddGroupSifting(table,lower,upper,ddNoCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK5) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else if (table->groupcheck == CUDD_GROUP_CHECK7) {
                    result = ddGroupSifting(table,lower,upper,ddExtSymmCheck,
                                            DD_NORMAL_SIFT);
                } else {
                    (void) fprintf(table->err,
                                   "Unknown group ckecking method\n");
                    result = 0;
                }
#ifdef DD_STATS
                (void) fprintf(table->out,"\n");
#endif
                result = cuddWindowReorder(table,lower,upper,
                                           CUDD_REORDER_WINDOW4);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_WINDOW2:
        case CUDD_REORDER_WINDOW3:
        case CUDD_REORDER_WINDOW4:
        case CUDD_REORDER_WINDOW2_CONV:
        case CUDD_REORDER_WINDOW3_CONV:
        case CUDD_REORDER_WINDOW4_CONV:
            result = cuddWindowReorder(table,lower,upper,method);
            break;
        case CUDD_REORDER_ANNEALING:
            result = cuddAnnealing(table,lower,upper);
            break;
        case CUDD_REORDER_GENETIC:
            result = cuddGa(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR:
            result = cuddLinearAndSifting(table,lower,upper);
            break;
        case CUDD_REORDER_LINEAR_CONVERGE:
            do {
                initialSize = table->keys - table->isolated;
                result = cuddLinearAndSifting(table,lower,upper);
                if (initialSize <= table->keys - table->isolated)
                    break;
#ifdef DD_STATS
                else
                    (void) fprintf(table->out,"\n");
#endif
            } while (result != 0);
            break;
        case CUDD_REORDER_EXACT:
            result = cuddExact(table,lower,upper);
            break;
        case CUDD_REORDER_LAZY_SIFT:
            result = ddGroupSifting(table,lower,upper,ddVarGroupCheck,
                                    DD_LAZY_SIFT);
            break;
        default:
            return(0);
        }
    }

    /* Create a single group for all the variables that were sifted,
    ** so that they will be treated as a single block by successive
    ** invocations of ddGroupSifting.
    */
    ddMergeGroups(table,treenode,lower,upper);

#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddReorderChildren:");
#endif

    return(result);

}